

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acceptor.cpp
# Opt level: O0

int Acceptor::setSocketNonBlocking(int fd)

{
  uint uVar1;
  int iVar2;
  int flag;
  int fd_local;
  
  uVar1 = fcntl(fd,3,0);
  if (uVar1 == 0xffffffff) {
    flag = -1;
  }
  else {
    iVar2 = fcntl(fd,4,(ulong)(uVar1 | 0x800));
    if (iVar2 == -1) {
      flag = -1;
    }
    else {
      flag = 0;
    }
  }
  return flag;
}

Assistant:

int Acceptor::setSocketNonBlocking(int fd)
{
	int flag = fcntl(fd, F_GETFL, 0);
  	if (flag == -1)
	       	return -1;
	flag |= O_NONBLOCK;
  	if (fcntl(fd, F_SETFL, flag) == -1) 
		return -1;
  	return 0;
}